

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O1

bool anon_unknown.dwarf_101ce38::DeduceVersionProfile
               (TInfoSink *infoSink,EShLanguage stage,bool versionNotFirst,int defaultVersion,
               EShSource source,int *version,EProfile *profile,SpvVersion *spvVersion)

{
  int iVar1;
  EProfile EVar2;
  int iVar3;
  char *s;
  EProfile EVar4;
  bool bVar5;
  
  if (source == EShSourceHlsl) {
    *version = 500;
    *profile = ECoreProfile;
    return true;
  }
  if (*version == 0) {
    *version = defaultVersion;
  }
  EVar2 = *profile;
  iVar3 = *version;
  if (EVar2 == ENoProfile) {
    EVar4 = EEsProfile;
    if ((iVar3 - 300U < 0x15) && ((0x100401U >> (iVar3 - 300U & 0x1f) & 1) != 0)) {
      s = "#version: versions 300, 310, and 320 require specifying the \'es\' profile";
LAB_003da191:
      glslang::TInfoSinkBase::message(&infoSink->info,EPrefixError,s);
      EVar4 = EEsProfile;
LAB_003da1a3:
      bVar5 = false;
    }
    else {
      bVar5 = true;
      if (iVar3 != 100) {
        EVar4 = (0x95 < iVar3) + ENoProfile;
      }
    }
LAB_003da1a6:
    *profile = EVar4;
  }
  else {
    if (iVar3 < 0x96) {
      glslang::TInfoSinkBase::message
                (&infoSink->info,EPrefixError,
                 "#version: versions before 150 do not allow a profile token");
      EVar4 = ENoProfile;
      if (*version == 100) {
        EVar4 = EEsProfile;
      }
      goto LAB_003da1a3;
    }
    if ((iVar3 - 300U < 0x15) && ((0x100401U >> (iVar3 - 300U & 0x1f) & 1) != 0)) {
      bVar5 = true;
      EVar4 = EEsProfile;
      if (EVar2 != EEsProfile) {
        s = "#version: versions 300, 310, and 320 support only the es profile";
        goto LAB_003da191;
      }
      goto LAB_003da1a6;
    }
    bVar5 = true;
    if (EVar2 == EEsProfile) {
      glslang::TInfoSinkBase::message
                (&infoSink->info,EPrefixError,
                 "#version: only version 300, 310, and 320 support the es profile");
      EVar4 = (0x95 < *version) + ENoProfile;
      goto LAB_003da1a3;
    }
  }
  iVar3 = *version;
  if ((((0x3c < iVar3 - 400U) || ((0x1004010040100401U >> ((ulong)(iVar3 - 400U) & 0x3f) & 1) == 0))
      && ((0x32 < iVar3 - 100U || ((0x4010040100401U >> ((ulong)(iVar3 - 100U) & 0x3f) & 1) == 0))))
     && ((0x1e < iVar3 - 300U || ((0x40100401U >> (iVar3 - 300U & 0x1f) & 1) == 0)))) {
    glslang::TInfoSinkBase::message(&infoSink->info,EPrefixError,"version not supported");
    if (*profile == EEsProfile) {
      *version = 0x136;
    }
    else {
      *version = 0x1c2;
      *profile = ECoreProfile;
    }
    bVar5 = false;
  }
  switch(stage) {
  case EShLangTessControl:
  case EShLangTessEvaluation:
    if ((*profile != EEsProfile || 0x135 < *version) && (0x95 < *version || *profile == EEsProfile))
    goto switchD_003da239_caseD_4;
    glslang::TInfoSinkBase::message
              (&infoSink->info,EPrefixError,
               "#version: tessellation shaders require es profile with version 310 or non-es profile with version 150 or above"
              );
    EVar2 = *profile;
    iVar3 = 400;
    break;
  case EShLangGeometry:
    if ((*profile != EEsProfile || 0x135 < *version) && (0x95 < *version || *profile == EEsProfile))
    goto switchD_003da239_caseD_4;
    glslang::TInfoSinkBase::message
              (&infoSink->info,EPrefixError,
               "#version: geometry shaders require es profile with version 310 or non-es profile with version 150 or above"
              );
    EVar2 = *profile;
    iVar3 = 0x96;
    break;
  default:
    goto switchD_003da239_caseD_4;
  case EShLangCompute:
    if ((*profile != EEsProfile || 0x135 < *version) && (0x1a3 < *version || *profile == EEsProfile)
       ) goto switchD_003da239_caseD_4;
    glslang::TInfoSinkBase::message
              (&infoSink->info,EPrefixError,
               "#version: compute shaders require es profile with version 310 or above, or non-es profile with version 420 or above"
              );
    EVar2 = *profile;
    iVar1 = 0x136;
    iVar3 = 0x1a4;
    goto LAB_003da40a;
  case EShLangRayGen:
  case EShLangIntersect:
  case EShLangAnyHit:
  case EShLangClosestHit:
  case EShLangMiss:
  case EShLangCallable:
    if ((*profile != EEsProfile) && (0x1cb < *version)) goto switchD_003da239_caseD_4;
    glslang::TInfoSinkBase::message
              (&infoSink->info,EPrefixError,
               "#version: ray tracing shaders require non-es profile with version 460 or above");
    *version = 0x1cc;
    goto LAB_003da40f;
  case EShLangTask:
  case EShLangMesh:
    if ((*profile != EEsProfile || 0x13f < *version) && (0x1c1 < *version || *profile == EEsProfile)
       ) goto switchD_003da239_caseD_4;
    glslang::TInfoSinkBase::message
              (&infoSink->info,EPrefixError,
               "#version: mesh/task shaders require es profile with version 320 or above, or non-es profile with version 450 or above"
              );
    EVar2 = *profile;
    iVar1 = 0x140;
    iVar3 = 0x1c2;
LAB_003da40a:
    if (EVar2 == EEsProfile) {
      iVar3 = iVar1;
    }
    *version = iVar3;
    goto LAB_003da40f;
  }
  if (EVar2 == EEsProfile) {
    iVar3 = 0x136;
  }
  *version = iVar3;
  if ((EVar2 == EEsProfile) || (EVar2 == ENoProfile)) {
    *profile = ECoreProfile;
  }
LAB_003da40f:
  bVar5 = false;
switchD_003da239_caseD_4:
  if ((299 < *version && versionNotFirst) && *profile == EEsProfile) {
    glslang::TInfoSinkBase::message
              (&infoSink->info,EPrefixError,
               "#version: statement must appear first in es-profile shader; before comments or newlines"
              );
    bVar5 = false;
  }
  if (spvVersion->spv != 0) {
    if (*profile == ECompatibilityProfile) {
      glslang::TInfoSinkBase::message
                (&infoSink->info,EPrefixError,
                 "#version: compilation for SPIR-V does not support the compatibility profile");
    }
    else {
      if (*profile == EEsProfile) {
        if (0x135 < *version) {
          return bVar5;
        }
        glslang::TInfoSinkBase::message
                  (&infoSink->info,EPrefixError,
                   "#version: ES shaders for SPIR-V require version 310 or higher");
        *version = 0x136;
      }
      else {
        if ((0 < spvVersion->vulkan) && (*version < 0x8c)) {
          glslang::TInfoSinkBase::message
                    (&infoSink->info,EPrefixError,
                     "#version: Desktop shaders for Vulkan SPIR-V require version 140 or higher");
          *version = 0x8c;
          bVar5 = false;
        }
        if (spvVersion->openGl < 100) {
          return bVar5;
        }
        if (0x149 < *version) {
          return bVar5;
        }
        glslang::TInfoSinkBase::message
                  (&infoSink->info,EPrefixError,
                   "#version: Desktop shaders for OpenGL SPIR-V require version 330 or higher");
        *version = 0x14a;
      }
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool DeduceVersionProfile(TInfoSink& infoSink, EShLanguage stage, bool versionNotFirst, int defaultVersion,
                          EShSource source, int& version, EProfile& profile, const SpvVersion& spvVersion)
{
    const int FirstProfileVersion = 150;
    bool correct = true;

    if (source == EShSourceHlsl) {
        version = 500;          // shader model; currently a characteristic of glslang, not the input
        profile = ECoreProfile; // allow doubles in prototype parsing
        return correct;
    }

    // Get a version...
    if (version == 0) {
        version = defaultVersion;
        // infoSink.info.message(EPrefixWarning, "#version: statement missing; use #version on first line of shader");
    }

    // Get a good profile...
    if (profile == ENoProfile) {
        if (version == 300 || version == 310 || version == 320) {
            correct = false;
            infoSink.info.message(EPrefixError, "#version: versions 300, 310, and 320 require specifying the 'es' profile");
            profile = EEsProfile;
        } else if (version == 100)
            profile = EEsProfile;
        else if (version >= FirstProfileVersion)
            profile = ECoreProfile;
        else
            profile = ENoProfile;
    } else {
        // a profile was provided...
        if (version < 150) {
            correct = false;
            infoSink.info.message(EPrefixError, "#version: versions before 150 do not allow a profile token");
            if (version == 100)
                profile = EEsProfile;
            else
                profile = ENoProfile;
        } else if (version == 300 || version == 310 || version == 320) {
            if (profile != EEsProfile) {
                correct = false;
                infoSink.info.message(EPrefixError, "#version: versions 300, 310, and 320 support only the es profile");
            }
            profile = EEsProfile;
        } else {
            if (profile == EEsProfile) {
                correct = false;
                infoSink.info.message(EPrefixError, "#version: only version 300, 310, and 320 support the es profile");
                if (version >= FirstProfileVersion)
                    profile = ECoreProfile;
                else
                    profile = ENoProfile;
            }
            // else: typical desktop case... e.g., "#version 410 core"
        }
    }

    // Fix version...
    switch (version) {
    // ES versions
    case 100: break;
    case 300: break;
    case 310: break;
    case 320: break;

    // desktop versions
    case 110: break;
    case 120: break;
    case 130: break;
    case 140: break;
    case 150: break;
    case 330: break;
    case 400: break;
    case 410: break;
    case 420: break;
    case 430: break;
    case 440: break;
    case 450: break;
    case 460: break;

    // unknown version
    default:
        correct = false;
        infoSink.info.message(EPrefixError, "version not supported");
        if (profile == EEsProfile)
            version = 310;
        else {
            version = 450;
            profile = ECoreProfile;
        }
        break;
    }

    // Correct for stage type...
    switch (stage) {
    case EShLangGeometry:
        if ((profile == EEsProfile && version < 310) ||
            (profile != EEsProfile && version < 150)) {
            correct = false;
            infoSink.info.message(EPrefixError, "#version: geometry shaders require es profile with version 310 or non-es profile with version 150 or above");
            version = (profile == EEsProfile) ? 310 : 150;
            if (profile == EEsProfile || profile == ENoProfile)
                profile = ECoreProfile;
        }
        break;
    case EShLangTessControl:
    case EShLangTessEvaluation:
        if ((profile == EEsProfile && version < 310) ||
            (profile != EEsProfile && version < 150)) {
            correct = false;
            infoSink.info.message(EPrefixError, "#version: tessellation shaders require es profile with version 310 or non-es profile with version 150 or above");
            version = (profile == EEsProfile) ? 310 : 400; // 150 supports the extension, correction is to 400 which does not
            if (profile == EEsProfile || profile == ENoProfile)
                profile = ECoreProfile;
        }
        break;
    case EShLangCompute:
        if ((profile == EEsProfile && version < 310) ||
            (profile != EEsProfile && version < 420)) {
            correct = false;
            infoSink.info.message(EPrefixError, "#version: compute shaders require es profile with version 310 or above, or non-es profile with version 420 or above");
            version = profile == EEsProfile ? 310 : 420;
        }
        break;
    case EShLangRayGen:
    case EShLangIntersect:
    case EShLangAnyHit:
    case EShLangClosestHit:
    case EShLangMiss:
    case EShLangCallable:
        if (profile == EEsProfile || version < 460) {
            correct = false;
            infoSink.info.message(EPrefixError, "#version: ray tracing shaders require non-es profile with version 460 or above");
            version = 460;
        }
        break;
    case EShLangMesh:
    case EShLangTask:
        if ((profile == EEsProfile && version < 320) ||
            (profile != EEsProfile && version < 450)) {
            correct = false;
            infoSink.info.message(EPrefixError, "#version: mesh/task shaders require es profile with version 320 or above, or non-es profile with version 450 or above");
            version = profile == EEsProfile ? 320 : 450;
        }
        break;
    default:
        break;
    }

    if (profile == EEsProfile && version >= 300 && versionNotFirst) {
        correct = false;
        infoSink.info.message(EPrefixError, "#version: statement must appear first in es-profile shader; before comments or newlines");
    }

    // Check for SPIR-V compatibility
    if (spvVersion.spv != 0) {
        switch (profile) {
        case EEsProfile:
            if (version < 310) {
                correct = false;
                infoSink.info.message(EPrefixError, "#version: ES shaders for SPIR-V require version 310 or higher");
                version = 310;
            }
            break;
        case ECompatibilityProfile:
            infoSink.info.message(EPrefixError, "#version: compilation for SPIR-V does not support the compatibility profile");
            break;
        default:
            if (spvVersion.vulkan > 0 && version < 140) {
                correct = false;
                infoSink.info.message(EPrefixError, "#version: Desktop shaders for Vulkan SPIR-V require version 140 or higher");
                version = 140;
            }
            if (spvVersion.openGl >= 100 && version < 330) {
                correct = false;
                infoSink.info.message(EPrefixError, "#version: Desktop shaders for OpenGL SPIR-V require version 330 or higher");
                version = 330;
            }
            break;
        }
    }

    return correct;
}